

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitarr.c
# Opt level: O1

void bitarr_write_int25(bitarr_address_t address,uint8 length,uint32 value)

{
  uint *puVar1;
  
  puVar1 = (uint *)((long)address.base + (ulong)(address.offset >> 3));
  *puVar1 = *puVar1 | value << ((byte)address.offset & 7);
  return;
}

Assistant:

void bitarr_write_int25(bitarr_address_t address, uint8 length, uint32 value)
{
    uint32 value32;
    uint8 *base_off = (uint8 *)(address.base) + (address.offset >> 3);
    (void)length; /* Yeah, what is this for anyway? */
    memcpy(&value32, base_off, sizeof(value32));
    SWAP_LE_32(&value32);
    value32 |= (value << (address.offset & 7));
    SWAP_LE_32(&value32);
    memcpy(base_off, &value32, sizeof(value32));
}